

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.cc
# Opt level: O1

void __thiscall
testing::internal::UnorderedElementsAreMatcherImplBase::DescribeNegationToImpl
          (UnorderedElementsAreMatcherImplBase *this,ostream *os)

{
  long lVar1;
  long *plVar2;
  bool bVar3;
  ostream *poVar4;
  size_t sVar5;
  char *__s;
  long lVar6;
  long *local_60;
  undefined1 local_58 [8];
  string local_50;
  
  lVar6 = *(long *)this;
  lVar1 = *(long *)&this->field_0x8;
  if (lVar6 != lVar1) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"doesn\'t have ",0xd);
    if (lVar1 - lVar6 == 8) {
      Elements((UnorderedElementsAreMatcherImplBase *)&local_60,1);
      Message::GetString_abi_cxx11_(&local_50,(Message *)&local_60);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,local_50._M_dataplus._M_p,local_50._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,", or has ",9);
      Elements((UnorderedElementsAreMatcherImplBase *)local_58,1);
      Message::GetString_abi_cxx11_(&local_50,(Message *)local_58);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,local_50._M_dataplus._M_p,local_50._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," that ",6);
      if (local_58 != (undefined1  [8])0x0) {
        bVar3 = IsTrue(true);
        if ((bVar3) && (local_58 != (undefined1  [8])0x0)) {
          (**(code **)(*(long *)local_58 + 8))();
        }
        local_58 = (undefined1  [8])0x0;
      }
      if (local_60 != (long *)0x0) {
        bVar3 = IsTrue(true);
        if ((bVar3) && (local_60 != (long *)0x0)) {
          (**(code **)(*local_60 + 8))();
        }
        local_60 = (long *)0x0;
      }
      (**(code **)(*(long *)**(undefined8 **)this + 0x18))((long *)**(undefined8 **)this,os);
    }
    else {
      Elements((UnorderedElementsAreMatcherImplBase *)&local_60,
               *(long *)&this->field_0x8 - *(long *)this >> 3);
      Message::GetString_abi_cxx11_(&local_50,(Message *)&local_60);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,local_50._M_dataplus._M_p,local_50._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,", or there exists no permutation of elements such that:\n",0x38);
      if (local_60 != (long *)0x0) {
        bVar3 = IsTrue(true);
        if ((bVar3) && (local_60 != (long *)0x0)) {
          (**(code **)(*local_60 + 8))();
        }
        local_60 = (long *)0x0;
      }
      if (*(long *)&this->field_0x8 != *(long *)this) {
        lVar6 = 0;
        __s = "";
        do {
          sVar5 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>(os,__s,sVar5);
          std::__ostream_insert<char,std::char_traits<char>>(os," - element #",0xc);
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)os);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
          plVar2 = *(long **)(*(long *)this + lVar6 * 8);
          (**(code **)(*plVar2 + 0x10))(plVar2,os);
          lVar6 = lVar6 + 1;
          __s = ", and\n";
        } while (lVar6 != *(long *)&this->field_0x8 - *(long *)this >> 3);
      }
    }
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"isn\'t empty",0xb);
  return;
}

Assistant:

void UnorderedElementsAreMatcherImplBase::DescribeNegationToImpl(
    ::std::ostream* os) const {
  if (matcher_describers_.empty()) {
    *os << "isn't empty";
    return;
  }
  if (matcher_describers_.size() == 1) {
    *os << "doesn't have " << Elements(1)
        << ", or has " << Elements(1) << " that ";
    matcher_describers_[0]->DescribeNegationTo(os);
    return;
  }
  *os << "doesn't have " << Elements(matcher_describers_.size())
      << ", or there exists no permutation of elements such that:\n";
  const char* sep = "";
  for (size_t i = 0; i != matcher_describers_.size(); ++i) {
    *os << sep << " - element #" << i << " ";
    matcher_describers_[i]->DescribeTo(os);
    sep = ", and\n";
  }
}